

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O1

void re2::DumpRegexpAppending(Regexp *re,string *s)

{
  uint uVar1;
  uint uVar2;
  CharClass *pCVar3;
  string *psVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar8;
  long lVar9;
  ulong uVar10;
  uint *puVar11;
  Rune r;
  string sep;
  string local_1d0;
  undefined1 local_1b0 [8];
  char *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [23];
  
  if (re->op_ < 0x16) {
    if ((re->op_ - 7 < 4) && ((re->parse_flags_ & 0x40) != 0)) {
      std::__cxx11::string::append((char *)s);
    }
    std::__cxx11::string::append((char *)s);
    if (((re->op_ == '\x03') && ((re->parse_flags_ & 1) != 0)) &&
       ((re->field_7).field_0.max_ - 0x61U < 0x1a)) {
      std::__cxx11::string::append((char *)s);
    }
    if (((re->op_ == '\x04') && ((re->parse_flags_ & 1) != 0)) &&
       (lVar6 = (long)(re->field_7).field_0.max_, 0 < lVar6)) {
      lVar9 = 0;
      do {
        if (0xffffffe5 <
            *(int *)((long)&(((re->field_7).field_1.name_)->_M_dataplus)._M_p + lVar9 * 4) - 0x7bU)
        {
          std::__cxx11::string::append((char *)s);
          break;
        }
        lVar9 = lVar9 + 1;
      } while (lVar6 != lVar9);
    }
  }
  else {
    StringAppendF(s,"op%d");
  }
  std::__cxx11::string::append((char *)s);
  switch(re->op_) {
  case '\x03':
    local_1d0._M_dataplus._M_p._0_4_ = (re->field_7).field_0.max_;
    iVar5 = runetochar(local_1b0,(Rune *)&local_1d0);
    local_1b0[iVar5] = 0;
    goto LAB_0011099b;
  case '\x04':
    if (re->op_ == '\x04') {
      lVar6 = 0;
      do {
        if ((re->field_7).field_0.max_ <= lVar6) goto switchD_0011071d_caseD_c;
        local_1d0._M_dataplus._M_p._0_4_ =
             *(int *)((long)&(((re->field_7).field_1.name_)->_M_dataplus)._M_p + lVar6 * 4);
        iVar5 = runetochar(local_1b0,(Rune *)&local_1d0);
        local_1b0[iVar5] = 0;
        std::__cxx11::string::append((char *)s);
        lVar6 = lVar6 + 1;
      } while (re->op_ == '\x04');
    }
    __assert_fail("(op_) == (kRegexpLiteralString)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h",
                  0x14e,"int re2::Regexp::nrunes()");
  case '\x05':
  case '\x06':
    uVar7 = (ulong)re->nsub_;
    if (re->nsub_ != 0) {
      uVar10 = 0;
      do {
        paVar8 = &re->field_5;
        if (1 < (ushort)uVar7) {
          paVar8 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
        }
        DumpRegexpAppending(paVar8[uVar10].subone_,s);
        uVar10 = uVar10 + 1;
        uVar7 = (ulong)re->nsub_;
      } while (uVar10 < uVar7);
    }
    goto switchD_0011071d_caseD_c;
  case '\a':
  case '\b':
  case '\t':
    break;
  case '\n':
    StringPrintf_abi_cxx11_
              ((string *)local_1b0,"%d,%d ",(ulong)(uint)(re->field_7).field_0.min_,
               (ulong)(uint)(re->field_7).field_0.max_);
    std::__cxx11::string::_M_append((char *)s,(ulong)local_1b0);
    if (local_1b0 != (undefined1  [8])local_1a0) {
      operator_delete((void *)local_1b0);
    }
    break;
  case '\v':
    if ((re->field_7).field_0.max_ == 0) {
      LogMessage::LogMessage
                ((LogMessage *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dump.cc"
                 ,0x7c,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"kRegexpCapture cap() == 0",0x19);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    if (re->op_ != '\v') {
      __assert_fail("(op_) == (kRegexpCapture)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h",
                    0x14c,"const string *re2::Regexp::name()");
    }
    psVar4 = (re->field_7).field_1.name_;
    if (psVar4 != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)s,(ulong)(psVar4->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)s);
    }
    break;
  default:
    goto switchD_0011071d_caseD_c;
  case '\x13':
    if ((short)re->parse_flags_ < 0) goto switchD_0011071d_caseD_c;
LAB_0011099b:
    std::__cxx11::string::append((char *)s);
    goto switchD_0011071d_caseD_c;
  case '\x14':
    local_1b0 = (undefined1  [8])local_1a0;
    local_1a8 = (char *)0x0;
    local_1a0[0]._M_local_buf[0] = '\0';
    if (re->op_ == '\x14') {
      puVar11 = *(uint **)((re->field_7).field_3.cc_ + 8);
      do {
        pCVar3 = (re->field_7).field_3.cc_;
        if (puVar11 == (uint *)((long)*(int *)(pCVar3 + 0x10) * 8 + *(long *)(pCVar3 + 8))) {
          if (local_1b0 != (undefined1  [8])local_1a0) {
            operator_delete((void *)local_1b0);
          }
          goto switchD_0011071d_caseD_c;
        }
        uVar1 = *puVar11;
        uVar2 = puVar11[1];
        std::__cxx11::string::_M_append((char *)s,(ulong)local_1b0);
        if (uVar1 == uVar2) {
          StringPrintf_abi_cxx11_(&local_1d0,"%#x",(ulong)uVar1);
          std::__cxx11::string::_M_append
                    ((char *)s,
                     CONCAT44(local_1d0._M_dataplus._M_p._4_4_,(int)local_1d0._M_dataplus._M_p));
        }
        else {
          StringPrintf_abi_cxx11_(&local_1d0,"%#x-%#x",(ulong)uVar1,(ulong)uVar2);
          std::__cxx11::string::_M_append
                    ((char *)s,
                     CONCAT44(local_1d0._M_dataplus._M_p._4_4_,(int)local_1d0._M_dataplus._M_p));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1d0._M_dataplus._M_p._4_4_,(int)local_1d0._M_dataplus._M_p) !=
            &local_1d0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_1d0._M_dataplus._M_p._4_4_,(int)local_1d0._M_dataplus._M_p)
                         );
        }
        std::__cxx11::string::_M_replace((ulong)local_1b0,0,local_1a8,0x11d379);
        puVar11 = puVar11 + 2;
      } while (re->op_ == '\x14');
    }
    __assert_fail("(op_) == (kRegexpCharClass)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h",
                  0x14a,"CharClass *re2::Regexp::cc()");
  }
  if (re->nsub_ < 2) {
    paVar8 = &re->field_5;
  }
  else {
    paVar8 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
  }
  DumpRegexpAppending(paVar8->subone_,s);
switchD_0011071d_caseD_c:
  std::__cxx11::string::append((char *)s);
  return;
}

Assistant:

static void DumpRegexpAppending(Regexp* re, string* s) {
  if (re->op() < 0 || re->op() >= arraysize(kOpcodeNames)) {
    StringAppendF(s, "op%d", re->op());
  } else {
    switch (re->op()) {
      default:
        break;
      case kRegexpStar:
      case kRegexpPlus:
      case kRegexpQuest:
      case kRegexpRepeat:
        if (re->parse_flags() & Regexp::NonGreedy)
          s->append("n");
        break;
    }
    s->append(kOpcodeNames[re->op()]);
    if (re->op() == kRegexpLiteral && (re->parse_flags() & Regexp::FoldCase)) {
      Rune r = re->rune();
      if ('a' <= r && r <= 'z')
        s->append("fold");
    }
    if (re->op() == kRegexpLiteralString && (re->parse_flags() & Regexp::FoldCase)) {
      for (int i = 0; i < re->nrunes(); i++) {
        Rune r = re->runes()[i];
        if ('a' <= r && r <= 'z') {
          s->append("fold");
          break;
        }
      }
    }
  }
  s->append("{");
  switch (re->op()) {
    default:
      break;
    case kRegexpEndText:
      if (!(re->parse_flags() & Regexp::WasDollar)) {
        s->append("\\z");
      }
      break;
    case kRegexpLiteral: {
      Rune r = re->rune();
      char buf[UTFmax+1];
      buf[runetochar(buf, &r)] = 0;
      s->append(buf);
      break;
    }
    case kRegexpLiteralString:
      for (int i = 0; i < re->nrunes(); i++) {
        Rune r = re->runes()[i];
        char buf[UTFmax+1];
        buf[runetochar(buf, &r)] = 0;
        s->append(buf);
      }
      break;
    case kRegexpConcat:
    case kRegexpAlternate:
      for (int i = 0; i < re->nsub(); i++)
        DumpRegexpAppending(re->sub()[i], s);
      break;
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      DumpRegexpAppending(re->sub()[0], s);
      break;
    case kRegexpCapture:
      if (re->cap() == 0)
        LOG(DFATAL) << "kRegexpCapture cap() == 0";
      if (re->name()) {
        s->append(*re->name());
        s->append(":");
      }
      DumpRegexpAppending(re->sub()[0], s);
      break;
    case kRegexpRepeat:
      s->append(StringPrintf("%d,%d ", re->min(), re->max()));
      DumpRegexpAppending(re->sub()[0], s);
      break;
    case kRegexpCharClass: {
      string sep;
      for (CharClass::iterator it = re->cc()->begin();
           it != re->cc()->end(); ++it) {
        RuneRange rr = *it;
        s->append(sep);
        if (rr.lo == rr.hi)
          s->append(StringPrintf("%#x", rr.lo));
        else
          s->append(StringPrintf("%#x-%#x", rr.lo, rr.hi));
        sep = " ";
      }
      break;
    }
  }
  s->append("}");
}